

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O3

DefaultValueObjectWriter * __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::EndList(DefaultValueObjectWriter *this)

{
  Node *pNVar1;
  _Elt_pointer ppNVar2;
  
  ppNVar2 = (this->stack_).c.
            super__Deque_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppNVar2 ==
      (this->stack_).c.
      super__Deque_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pNVar1 = (this->root_)._M_t.
             super___uniq_ptr_impl<google::protobuf::util::converter::DefaultValueObjectWriter::Node,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_false>
             ._M_head_impl;
    (*pNVar1->_vptr_Node[3])(pNVar1,this->ow_);
    pNVar1 = (this->root_)._M_t.
             super___uniq_ptr_impl<google::protobuf::util::converter::DefaultValueObjectWriter::Node,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_false>
             ._M_head_impl;
    (this->root_)._M_t.
    super___uniq_ptr_impl<google::protobuf::util::converter::DefaultValueObjectWriter::Node,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
    .
    super__Head_base<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_false>
    ._M_head_impl = (Node *)0x0;
    if (pNVar1 != (Node *)0x0) {
      (*pNVar1->_vptr_Node[1])();
    }
    this->current_ = (Node *)0x0;
  }
  else {
    if (ppNVar2 ==
        (this->stack_).c.
        super__Deque_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppNVar2 = (this->stack_).c.
                super__Deque_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this->current_ = ppNVar2[-1];
    std::
    deque<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ::pop_back(&(this->stack_).c);
  }
  return this;
}

Assistant:

DefaultValueObjectWriter* DefaultValueObjectWriter::EndList() {
  if (stack_.empty()) {
    WriteRoot();
    return this;
  }
  current_ = stack_.top();
  stack_.pop();
  return this;
}